

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

int av1_get_overlap_area(int row_a,int col_a,int row_b,int col_b,int width,int height)

{
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int max_col;
  int min_col;
  int max_row;
  int min_row;
  int height_local;
  int width_local;
  int col_b_local;
  int row_b_local;
  int col_a_local;
  int row_a_local;
  int local_4;
  
  local_30 = row_b;
  if (row_b < row_a) {
    local_30 = row_a;
  }
  if (row_a + height < row_b + height) {
    local_34 = row_a + height;
  }
  else {
    local_34 = row_b + height;
  }
  local_38 = col_b;
  if (col_b < col_a) {
    local_38 = col_a;
  }
  if (col_a + width < col_b + width) {
    local_3c = col_a + width;
  }
  else {
    local_3c = col_b + width;
  }
  if ((local_30 < local_34) && (local_38 < local_3c)) {
    local_4 = (local_34 - local_30) * (local_3c - local_38);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int av1_get_overlap_area(int row_a, int col_a, int row_b, int col_b, int width,
                         int height) {
  int min_row = AOMMAX(row_a, row_b);
  int max_row = AOMMIN(row_a + height, row_b + height);
  int min_col = AOMMAX(col_a, col_b);
  int max_col = AOMMIN(col_a + width, col_b + width);
  if (min_row < max_row && min_col < max_col) {
    return (max_row - min_row) * (max_col - min_col);
  }
  return 0;
}